

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O0

void __thiscall tcu::FileResource::~FileResource(FileResource *this)

{
  FileResource *this_local;
  
  ~FileResource(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

FileResource::~FileResource ()
{
	fclose(m_file);
}